

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

string * __thiscall
cmFindProgramCommand::FindAppBundle_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference __lhs;
  ulong uVar2;
  allocator<char> local_d5;
  uint local_d4;
  undefined1 local_d0 [8];
  string executable;
  string appPath;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string appName;
  string *name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmFindProgramCommand *this_local;
  
  this_00 = &(this->super_cmFindBase).Names;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  name = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&name);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_d5);
      std::allocator<char>::~allocator(&local_d5);
      return __return_storage_ptr__;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    appName.field_2._8_8_ = __lhs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,".app",&local_79);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   __lhs,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    cmsys::SystemTools::FindDirectory
              ((string *)((long)&executable.field_2 + 8),(string *)local_58,
               &(this->super_cmFindBase).super_cmFindCommon.SearchPaths,true);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      GetBundleExecutable((string *)local_d0,this,(string *)((long)&executable.field_2 + 8));
      uVar2 = std::__cxx11::string::empty();
      bVar1 = (uVar2 & 1) == 0;
      if (bVar1) {
        cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,(string *)local_d0);
      }
      local_d4 = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_d0);
      if (local_d4 == 0) goto LAB_003ff7bf;
    }
    else {
LAB_003ff7bf:
      local_d4 = 0;
    }
    std::__cxx11::string::~string((string *)(executable.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_58);
    if (local_d4 != 0) {
      return __return_storage_ptr__;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string cmFindProgramCommand::FindAppBundle()
{
  for (std::string const& name : this->Names) {

    std::string appName = name + std::string(".app");
    std::string appPath =
      cmSystemTools::FindDirectory(appName, this->SearchPaths, true);

    if (!appPath.empty()) {
      std::string executable = this->GetBundleExecutable(appPath);
      if (!executable.empty()) {
        return cmSystemTools::CollapseFullPath(executable);
      }
    }
  }

  // Couldn't find app bundle
  return "";
}